

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O1

word Gia_ObjComputeTruth6(Gia_Man_t *p,int iObj,Vec_Int_t *vSupp,Vec_Wrd_t *vTemp)

{
  int iVar1;
  int *piVar2;
  word *pwVar3;
  long lVar4;
  
  if (vTemp->nSize != p->nObjs) {
    __assert_fail("Vec_WrdSize(vTemp) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                  ,0x154,"word Gia_ObjComputeTruth6(Gia_Man_t *, int, Vec_Int_t *, Vec_Wrd_t *)");
  }
  if (6 < vSupp->nSize) {
    __assert_fail("Vec_IntSize(vSupp) <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                  ,0x155,"word Gia_ObjComputeTruth6(Gia_Man_t *, int, Vec_Int_t *, Vec_Wrd_t *)");
  }
  Gia_ManIncrementTravId(p);
  if (0 < vSupp->nSize) {
    piVar2 = vSupp->pArray;
    pwVar3 = s_Truths6;
    lVar4 = 0;
    do {
      iVar1 = piVar2[lVar4];
      if (p->nTravIdsAlloc <= iVar1) {
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
      }
      p->pTravIds[iVar1] = p->nTravIds;
      if ((iVar1 < 0) || (vTemp->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
      }
      vTemp->pArray[iVar1] = *pwVar3;
      lVar4 = lVar4 + 1;
      pwVar3 = pwVar3 + 1;
    } while (lVar4 < vSupp->nSize);
  }
  Gia_ObjComputeTruthTable6Lut_rec(p,iObj,vTemp);
  if ((-1 < iObj) && (iObj < vTemp->nSize)) {
    return vTemp->pArray[(uint)iObj];
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
}

Assistant:

word Gia_ObjComputeTruth6( Gia_Man_t * p, int iObj, Vec_Int_t * vSupp, Vec_Wrd_t * vTemp )
{
    int i, Fanin;
    assert( Vec_WrdSize(vTemp) == Gia_ManObjNum(p) );
    assert( Vec_IntSize(vSupp) <= 6 );
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vSupp, Fanin, i )
    {
        Gia_ObjSetTravIdCurrentId( p, Fanin );
        Vec_WrdWriteEntry( vTemp, Fanin, s_Truth6[i] );
    }
    Gia_ObjComputeTruthTable6Lut_rec( p, iObj, vTemp );
    return Vec_WrdEntry( vTemp, iObj );
}